

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederate::registerEndpoint
          (MessageFederate *this,string_view eptName,string_view type,bool global,bool targeted)

{
  Endpoint *pEVar1;
  
  if (!targeted) {
    if (!global) {
      pEVar1 = registerEndpoint(this,eptName,type);
      return pEVar1;
    }
    pEVar1 = MessageFederateManager::registerEndpoint
                       ((this->mfManager)._M_t.
                        super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                        .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl
                        ,eptName,type);
    return pEVar1;
  }
  if (!global) {
    pEVar1 = registerTargetedEndpoint(this,eptName,type);
    return pEVar1;
  }
  pEVar1 = MessageFederateManager::registerTargetedEndpoint
                     ((this->mfManager)._M_t.
                      super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                      .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl,
                      eptName,type);
  return pEVar1;
}

Assistant:

Endpoint& MessageFederate::registerEndpoint(std::string_view eptName,
                                            std::string_view type,
                                            bool global,
                                            bool targeted)
{
    if (targeted) {
        if (global) {
            return registerGlobalTargetedEndpoint(eptName, type);
        }
        return registerTargetedEndpoint(eptName, type);
    }
    if (global) {
        return registerGlobalEndpoint(eptName, type);
    }
    return registerEndpoint(eptName, type);
}